

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsData.cpp
# Opt level: O2

int32_t helicsDataBufferFillFromNamedPoint(HelicsDataBuffer data,char *name,double val)

{
  SmallBuffer *store;
  size_t sVar1;
  int32_t iVar2;
  _Alloc_hider _Var3;
  string_view valname;
  NamedPoint local_40;
  
  store = getBuffer(data);
  iVar2 = 0;
  if (store != (SmallBuffer *)0x0) {
    sVar1 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var3 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
    if (name != (char *)0x0) {
      sVar1 = strlen(name);
      _Var3._M_p = name;
    }
    valname._M_str = _Var3._M_p;
    valname._M_len = sVar1;
    helics::NamedPoint::NamedPoint(&local_40,valname,val);
    helics::ValueConverter<helics::NamedPoint>::convert(&local_40,store);
    std::__cxx11::string::~string((string *)&local_40);
    iVar2 = (int32_t)store->bufferSize;
  }
  return iVar2;
}

Assistant:

int32_t helicsDataBufferFillFromNamedPoint(HelicsDataBuffer data, const char* name, double val)
{
    auto* ptr = getBuffer(data);
    if (ptr == nullptr) {
        return 0;
    }
    try {
        helics::ValueConverter<helics::NamedPoint>::convert(helics::NamedPoint(AS_STRING_VIEW(name), val), *ptr);
        return static_cast<int32_t>(ptr->size());
    }
    catch (const std::bad_alloc&) {
        return 0;
    }
}